

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

int __thiscall cmGraphVizWriter::CollectAllExternalLibs(cmGraphVizWriter *this,int cnt)

{
  cmGeneratorTarget *this_00;
  pointer ppVar1;
  pointer pcVar2;
  bool bVar3;
  string *name;
  LinkLibraryVectorType *pLVar4;
  cmTarget *this_01;
  iterator iVar5;
  ostream *this_02;
  mapped_type *this_03;
  mapped_type *ppcVar6;
  pointer ppcVar7;
  pointer ppVar8;
  string libName;
  ostringstream ostr;
  int local_21c;
  string local_210;
  pointer local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1d8;
  _Base_ptr local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8 = (this->LocalGenerators->
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_1f0 = (this->LocalGenerators->
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_21c = cnt;
  if (local_1e8 != local_1f0) {
    local_1d0 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1d8 = &this->TargetNamesNodes;
    do {
      ppcVar7 = ((*local_1e8)->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_1e0 = ((*local_1e8)->GeneratorTargets).
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      if (ppcVar7 != local_1e0) {
        do {
          this_00 = *ppcVar7;
          name = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
          bVar3 = IgnoreThisTarget(this,name);
          if (!bVar3) {
            pLVar4 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this_00->Target);
            ppVar1 = (pLVar4->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar8 = (pLVar4->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                          )._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar1;
                ppVar8 = ppVar8 + 1) {
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              pcVar2 = (ppVar8->first)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_210,pcVar2,pcVar2 + (ppVar8->first)._M_string_length);
              bVar3 = IgnoreThisTarget(this,&local_210);
              if (!bVar3) {
                bVar3 = cmGlobalGenerator::IsAlias(this->GlobalGenerator,&local_210);
                if ((bVar3) &&
                   (this_01 = cmGlobalGenerator::FindTarget(this->GlobalGenerator,&local_210,false),
                   this_01 != (cmTarget *)0x0)) {
                  cmTarget::GetName_abi_cxx11_(this_01);
                  std::__cxx11::string::_M_assign((string *)&local_210);
                }
                iVar5 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                        ::find(&(this->TargetPtrs)._M_t,&local_210);
                if (iVar5._M_node == local_1d0) {
                  std::__cxx11::ostringstream::ostringstream(local_1a8);
                  this_02 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,(this->GraphNodePrefix)._M_dataplus._M_p
                                       ,(this->GraphNodePrefix)._M_string_length);
                  std::ostream::operator<<(this_02,local_21c);
                  std::__cxx11::stringbuf::str();
                  this_03 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](local_1d8,&local_210);
                  std::__cxx11::string::operator=((string *)this_03,(string *)local_1c8);
                  if (local_1c8[0] != local_1b8) {
                    operator_delete(local_1c8[0],local_1b8[0] + 1);
                  }
                  ppcVar6 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                            ::operator[](&this->TargetPtrs,&local_210);
                  local_21c = local_21c + 1;
                  *ppcVar6 = (mapped_type)0x0;
                  std::__cxx11::ostringstream::~ostringstream(local_1a8);
                  std::ios_base::~ios_base(local_138);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
            }
          }
          ppcVar7 = ppcVar7 + 1;
        } while (ppcVar7 != local_1e0);
      }
      local_1e8 = local_1e8 + 1;
    } while (local_1e8 != local_1f0);
  }
  return local_21c;
}

Assistant:

int cmGraphVizWriter::CollectAllExternalLibs(int cnt)
{
  // Ok, now find all the stuff we link to that is not in cmake
  for (cmLocalGenerator* lg : this->LocalGenerators) {
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      const std::string& realTargetName = target->GetName();
      if (this->IgnoreThisTarget(realTargetName)) {
        // Skip ignored targets
        continue;
      }
      const cmTarget::LinkLibraryVectorType* ll =
        &(target->Target->GetOriginalLinkLibraries());
      for (auto const& llit : *ll) {
        std::string libName = llit.first;
        if (this->IgnoreThisTarget(libName)) {
          // Skip ignored targets
          continue;
        }

        if (GlobalGenerator->IsAlias(libName)) {
          const auto tgt = GlobalGenerator->FindTarget(libName);
          if (tgt) {
            libName = tgt->GetName();
          }
        }

        std::map<std::string, const cmGeneratorTarget*>::const_iterator tarIt =
          this->TargetPtrs.find(libName);
        if (tarIt == this->TargetPtrs.end()) {
          std::ostringstream ostr;
          ostr << this->GraphNodePrefix << cnt++;
          this->TargetNamesNodes[libName] = ostr.str();
          this->TargetPtrs[libName] = nullptr;
          // str << "    \"" << ostr << "\" [ label=\"" << libName
          // <<  "\" shape=\"ellipse\"];" << std::endl;
        }
      }
    }
  }
  return cnt;
}